

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

int writeEOS(roslz4_stream *str)

{
  void *pvVar1;
  uint val;
  roslz4_stream *in_RDI;
  uint32_t stream_checksum;
  stream_state *state;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI->output_left < 8) {
    local_4 = -2;
  }
  else {
    pvVar1 = in_RDI->state;
    *(undefined4 *)((long)pvVar1 + 0x20) = 1;
    writeUInt32((uchar *)in_RDI->output_next,0);
    advanceOutput(in_RDI,4);
    val = XXH32_digest(in_stack_ffffffffffffffd8);
    writeUInt32((uchar *)in_RDI->output_next,val);
    advanceOutput(in_RDI,4);
    *(undefined8 *)((long)pvVar1 + 0x28) = 0;
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int writeEOS(roslz4_stream *str) {
  if (str->output_left < 8) {
    return ROSLZ4_OUTPUT_SMALL;
  }

  stream_state *state = str->state;
  state->finished = 1;
  writeUInt32((unsigned char*) str->output_next, kEndOfStream);
  advanceOutput(str, 4);

  uint32_t stream_checksum = XXH32_digest(state->xxh32_state);
  writeUInt32((unsigned char*) str->output_next, stream_checksum);
  advanceOutput(str, 4);
  state->xxh32_state = NULL;

  DEBUG("writeEOS() Wrote 8 bytes to output %i\n", str->output_left);
  return ROSLZ4_STREAM_END;
}